

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

uchar * EmergencyFindTable_UuidHelper
                  (bool bReverseByteOrder,size_t sizeof_chunk_value,uchar *buffer,uchar *buffer_end,
                  ON__UINT32 expected_tcode,ON_UUID *expected_uuid)

{
  bool bVar1;
  ON__UINT32 OVar2;
  uchar *puVar3;
  ulong uVar4;
  bool bVar5;
  ON__UINT32 c;
  uint uStack_4c;
  ON_UUID uuid;
  ON__INT64 chunk_value;
  
  puVar3 = BufferValidateTcode(bReverseByteOrder,buffer,buffer_end,expected_tcode);
  if (puVar3 != (uchar *)0x0) {
    chunk_value = -1;
    uVar4 = (ulong)bReverseByteOrder;
    puVar3 = BufferToChunkValue(bReverseByteOrder,sizeof_chunk_value,puVar3,buffer_end,&chunk_value)
    ;
    if (-1 < chunk_value && puVar3 != (uchar *)0x0) {
      bVar5 = sizeof_chunk_value + 0x31 <= (ulong)chunk_value;
      if (((((chunk_value == 0x14 || bVar5 && expected_tcode == 0x20008080) &&
            (_c = (ulong)uStack_4c << 0x20, puVar3 < buffer_end)) &&
           (0xf < (long)buffer_end - (long)puVar3)) &&
          ((puVar3 = BufferToUINT32(bReverseByteOrder,puVar3,buffer_end,&c), puVar3 != (uchar *)0x0
           && (1 < (long)buffer_end - (long)puVar3 && puVar3 < buffer_end)))) &&
         ((1 < (long)buffer_end - (long)(puVar3 + 2) && puVar3 + 2 < buffer_end &&
          (puVar3 + 4 < buffer_end && 7 < (long)buffer_end - (long)(puVar3 + 4))))) {
        uuid.Data1 = c;
        uuid.Data2 = CONCAT11(puVar3[!bReverseByteOrder],puVar3[uVar4]);
        uuid.Data3 = CONCAT11(puVar3[uVar4 ^ 3],puVar3[uVar4 + 2]);
        uuid.Data4 = *(uchar (*) [8])(puVar3 + 4);
        if ((expected_uuid == (ON_UUID *)0x0) || (bVar1 = operator!=(&uuid,expected_uuid), !bVar1))
        {
          puVar3 = puVar3 + 0xc;
          if (bVar5 && expected_tcode == 0x20008080) {
            puVar3 = BufferValidateTcode(bReverseByteOrder,puVar3,buffer_end,0x20008082);
            if (puVar3 == (uchar *)0x0) {
              return (uchar *)0x0;
            }
            _c = -1;
            puVar3 = BufferToChunkValue(bReverseByteOrder,sizeof_chunk_value,puVar3,buffer_end,
                                        (ON__INT64 *)&c);
            if (puVar3 == (uchar *)0x0) {
              return (uchar *)0x0;
            }
            if (_c < 0x19) {
              return (uchar *)0x0;
            }
            if (buffer_end <= puVar3 || (long)buffer_end - (long)puVar3 < _c) {
              return (uchar *)0x0;
            }
            puVar3 = puVar3 + _c;
          }
          puVar3 = BufferToUINT32(bReverseByteOrder,puVar3,buffer_end,&c);
          if (puVar3 != (uchar *)0x0) {
            OVar2 = ON_CRC32(0,4,&uuid);
            OVar2 = ON_CRC32(OVar2,2,&uuid.Data2);
            OVar2 = ON_CRC32(OVar2,2,&uuid.Data3);
            OVar2 = ON_CRC32(OVar2,8,uuid.Data4);
            if (c == OVar2) {
              return puVar3;
            }
            return (uchar *)0x0;
          }
        }
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

static
const unsigned char* EmergencyFindTable_UuidHelper( 
          bool bReverseByteOrder,
          size_t sizeof_chunk_value, 
          const unsigned char* buffer,
          const unsigned char* buffer_end,
          const ON__UINT32 expected_tcode,
          const ON_UUID* expected_uuid
          )
{
  ON__INT64 chunk_value;
  ON__UINT32 c, cc;
  ON_UUID uuid;

  // make sure the value at the start of the buffer = expected_tcode.
  buffer = BufferValidateTcode(bReverseByteOrder,buffer,buffer_end,expected_tcode);
  if ( 0 == buffer )
    return 0;

  // get length of this chunk containing the uuid
  chunk_value = -1;
  buffer = BufferToChunkValue( bReverseByteOrder,sizeof_chunk_value,buffer,buffer_end,&chunk_value );
  if ( 0 == buffer || chunk_value < 0 )
    return 0;

  // determine how long the chunk is supposed to be and validate the length.
  //
  // The "16+4+sizeof_chunk_value+21+4+4" in the bLookForUserTableRecordHeader
  // breaks down as:
  //  16                       sizeof(uuid)
  //  +4                     + sizeof(TCODE_USER_TABLE_RECORD_HEADER chunk typecode)
  //  +sizeof_chunk_value    + sizeof(TCODE_USER_TABLE_RECORD_HEADER chunk length)
  //  +21                    + major ver, minor ver, bool, archive ver, 3dm ver
  //  +4                     + sizeof(TCODE_USER_TABLE_RECORD_HEADER chunk crc)
  //  +4                     + sizeof(TCODE_USER_TABLE_UUID chunk crc)
  const bool bLookForUserTableRecordHeader = (TCODE_USER_TABLE_UUID == expected_tcode
                                              && ((ON__UINT64)chunk_value) >= (16+4+sizeof_chunk_value+21+4+4)
                                             );
  if ( !bLookForUserTableRecordHeader && 20 != chunk_value )
    return 0;
  buffer = BufferToUuid(bReverseByteOrder,buffer,buffer_end,uuid);
  if ( 0 == buffer )
    return 0;
  if( 0 != expected_uuid && uuid != *expected_uuid )
    return 0;
  
  if ( bLookForUserTableRecordHeader )
  {
    // make sure there is a TCODE_USER_TABLE_RECORD_HEADER chunk and skip over it.
    buffer = BufferValidateTcode(bReverseByteOrder,buffer,buffer_end,TCODE_USER_TABLE_RECORD_HEADER);
    if ( 0 == buffer )
      return 0;
    // get length of the TCODE_USER_TABLE_RECORD_HEADER chunk
    ON__INT64 header_length = -1;
    buffer = BufferToChunkValue( bReverseByteOrder,sizeof_chunk_value,buffer,buffer_end,&header_length );
    if ( 0 == buffer )
      return 0;
    if ( header_length < 25 )
      return 0;
    if ( buffer >= buffer_end || buffer_end - buffer < header_length )
      return 0;
    buffer += header_length;
  }

  buffer = BufferToUINT32(bReverseByteOrder,buffer,buffer_end,&c);
  if ( 0 == buffer )
    return 0;
  cc = ON_CRC32(0,4,&uuid.Data1);
  cc = ON_CRC32(cc,2,&uuid.Data2);
  cc = ON_CRC32(cc,2,&uuid.Data3);
  cc = ON_CRC32(cc,8,&uuid.Data4[0]);
  if ( c != cc )
    return 0;

  return buffer;
}